

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  char *z;
  int iVar1;
  int iVar2;
  long lVar3;
  double rValue;
  double local_30;
  
  z = pRec->z;
  iVar2 = pRec->n;
  enc = pRec->enc;
  iVar1 = sqlite3AtoF(z,&local_30,iVar2,enc);
  if (iVar1 < 1) {
    return;
  }
  if (iVar1 == 1) {
    lVar3 = 0x7fffffffffffffff;
    if (-9.223372036854775e+18 <= local_30) {
      if (local_30 <= 9.223372036854775e+18) {
        lVar3 = (long)local_30;
      }
    }
    else {
      lVar3 = -0x8000000000000000;
    }
    if (((local_30 == 0.0) && (!NAN(local_30))) ||
       ((0xffe < (uint)((ulong)(lVar3 + -0x8000000000000) >> 0x34) && (local_30 == (double)lVar3))))
    {
      (pRec->u).i = lVar3;
    }
    else {
      iVar2 = sqlite3Atoi64(z,(i64 *)pRec,iVar2,enc);
      if (iVar2 != 0) goto LAB_00126491;
    }
    *(byte *)&pRec->flags = (byte)pRec->flags | 4;
  }
  else {
LAB_00126491:
    (pRec->u).r = local_30;
    *(byte *)&pRec->flags = (byte)pRec->flags | 8;
    if (bTryForInt != 0) {
      sqlite3VdbeIntegerAffinity(pRec);
    }
  }
  *(byte *)&pRec->flags = (byte)pRec->flags & 0xfd;
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  u8 enc = pRec->enc;
  int rc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real|MEM_IntReal))==MEM_Str );
  rc = sqlite3AtoF(pRec->z, &rValue, pRec->n, enc);
  if( rc<=0 ) return;
  if( rc==1 && alsoAnInt(pRec, rValue, &pRec->u.i) ){
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}